

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cc
# Opt level: O2

int main(int argc,char **argv)

{
  TempFile *__return_storage_ptr__;
  undefined1 __stream [8];
  undefined8 __stream_00;
  TestingPortal *pTVar1;
  undefined8 *puVar2;
  long *plVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  bool bVar7;
  string_view base_template;
  string_view base_template_00;
  string_view path;
  string_view path_00;
  string_view argv0;
  string_view argv0_00;
  undefined1 local_a0 [8];
  TempFile heap_tmp;
  TempFile growth_tmp;
  Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_sampling_test_cc:187:34)>
  unlink_temps;
  string s;
  
  pTVar1 = tcmalloc::TestingPortal::Get();
  puVar2 = (undefined8 *)(**(code **)(*(long *)pTVar1 + 0x28))(pTVar1);
  *puVar2 = 0x80000;
  plVar3 = (long *)MallocExtension::instance();
  pcVar5 = (char *)*plVar3;
  (**(code **)(pcVar5 + 0x68))(plVar3);
  iVar6 = 8000;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    AllocateAllocate();
  }
  base_template._M_str = pcVar5;
  base_template._M_len = (size_t)"sampling_test.heap.XXXXXX";
  TempFile::Create((TempFile *)local_a0,(TempFile *)0x19,base_template);
  __return_storage_ptr__ = (TempFile *)((long)&heap_tmp.path.field_2 + 8);
  base_template_00._M_str = pcVar5;
  base_template_00._M_len = (size_t)"sampling_test.growth.XXXXXX";
  TempFile::Create(__return_storage_ptr__,(TempFile *)0x1b,base_template_00);
  unlink_temps.callback_.growth_tmp = (TempFile *)&s._M_string_length;
  s._M_dataplus._M_p = (pointer)0x0;
  s._M_string_length._0_1_ = 0;
  growth_tmp.path.field_2._8_8_ = (TempFile *)local_a0;
  unlink_temps.callback_.heap_tmp = __return_storage_ptr__;
  plVar3 = (long *)MallocExtension::instance();
  (**(code **)(*plVar3 + 0x40))(plVar3,&unlink_temps.callback_.growth_tmp);
  fwrite(unlink_temps.callback_.growth_tmp,1,(size_t)s._M_dataplus._M_p,(FILE *)local_a0);
  __stream = local_a0;
  local_a0 = (undefined1  [8])0x0;
  fclose((FILE *)__stream);
  s._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&(unlink_temps.callback_.growth_tmp)->f = 0;
  plVar3 = (long *)MallocExtension::instance();
  (**(code **)(*plVar3 + 0x48))(plVar3,&unlink_temps.callback_.growth_tmp);
  fwrite(unlink_temps.callback_.growth_tmp,1,(size_t)s._M_dataplus._M_p,
         (FILE *)heap_tmp.path.field_2._8_8_);
  __stream_00 = heap_tmp.path.field_2._8_8_;
  heap_tmp.path.field_2._8_8_ = 0;
  fclose((FILE *)__stream_00);
  pcVar5 = *argv;
  sVar4 = strlen(pcVar5);
  path._M_str = (char *)heap_tmp.f;
  path._M_len = (size_t)heap_tmp.path._M_dataplus._M_p;
  argv0._M_str = pcVar5;
  argv0._M_len = sVar4;
  VerifyWithPProf(argv0,path);
  pcVar5 = *argv;
  sVar4 = strlen(pcVar5);
  path_00._M_str = (char *)growth_tmp.f;
  path_00._M_len = (size_t)growth_tmp.path._M_dataplus._M_p;
  argv0_00._M_str = pcVar5;
  argv0_00._M_len = sVar4;
  VerifyWithPProf(argv0_00,path_00);
  std::__cxx11::string::~string((string *)&unlink_temps.callback_.growth_tmp);
  tcmalloc::
  Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampling_test.cc:187:34)>
  ::~Cleanup((Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_sampling_test_cc:187:34)>
              *)((long)&growth_tmp.path.field_2 + 8));
  TempFile::~TempFile((TempFile *)((long)&heap_tmp.path.field_2 + 8));
  TempFile::~TempFile((TempFile *)local_a0);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  tcmalloc::TestingPortal::Get()->GetSampleParameter() = 512 << 10;
  // Make sure allocations we sample are done on fresh thread cache, so that
  // sampling parameter update is taken into account.
  MallocExtension::instance()->MarkThreadIdle();

  for (int i = 0; i < 8000; i++) {
    AllocateAllocate();
  }

  TempFile heap_tmp = TempFile::Create("sampling_test.heap.XXXXXX");
  TempFile growth_tmp = TempFile::Create("sampling_test.growth.XXXXXX");
  tcmalloc::Cleanup unlink_temps{[&] () {
    (void)unlink(heap_tmp.path.c_str());
    (void)unlink(growth_tmp.path.c_str());
  }};

  std::string s;
  MallocExtension::instance()->GetHeapSample(&s);
  fwrite(s.data(), 1, s.size(), heap_tmp.f);
  fclose(heap_tmp.ReleaseFile());

  s.clear();
  MallocExtension::instance()->GetHeapGrowthStacks(&s);
  fwrite(s.data(), 1, s.size(), growth_tmp.f);
  fclose(growth_tmp.ReleaseFile());

  VerifyWithPProf(argv[0], heap_tmp.path);
  VerifyWithPProf(argv[0], growth_tmp.path);
}